

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int pre_match(c2m_ctx_t c2m_ctx,int c,pos_t *pos,node_code_t *node_code,node_t_conflict *node)

{
  pre_ctx *ppVar1;
  int iVar2;
  size_t sVar3;
  token_t ptVar4;
  token_t t;
  pre_ctx_t pre_ctx;
  node_t_conflict *node_local;
  node_code_t *node_code_local;
  pos_t *pos_local;
  int c_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->pre_ctx;
  sVar3 = VARR_token_tlength(ppVar1->pre_expr);
  if (sVar3 == 0) {
    c2m_ctx_local._4_4_ = 0;
  }
  else {
    ptVar4 = VARR_token_tlast(ppVar1->pre_expr);
    if ((short)*(undefined4 *)ptVar4 == c) {
      if (pos != (pos_t *)0x0) {
        pos->fname = (ptVar4->pos).fname;
        iVar2 = (ptVar4->pos).ln_pos;
        pos->lno = (ptVar4->pos).lno;
        pos->ln_pos = iVar2;
      }
      if (node_code != (node_code_t *)0x0) {
        *node_code = ptVar4->node_code;
      }
      if (node != (node_t_conflict *)0x0) {
        *node = ptVar4->node;
      }
      VARR_token_tpop(ppVar1->pre_expr);
      c2m_ctx_local._4_4_ = 1;
    }
    else {
      c2m_ctx_local._4_4_ = 0;
    }
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static int pre_match (c2m_ctx_t c2m_ctx, int c, pos_t *pos, node_code_t *node_code, node_t *node) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  token_t t;

  if (VARR_LENGTH (token_t, pre_expr) == 0) return FALSE;
  t = VARR_LAST (token_t, pre_expr);
  if (t->code != c) return FALSE;
  if (pos != NULL) *pos = t->pos;
  if (node_code != NULL) *node_code = t->node_code;
  if (node != NULL) *node = t->node;
  VARR_POP (token_t, pre_expr);
  return TRUE;
}